

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xreq.c
# Opt level: O1

int nn_xreq_send_to(nn_sockbase *self,nn_msg *msg,nn_pipe **to)

{
  int iVar1;
  int iVar2;
  
  iVar1 = nn_lb_send((nn_lb *)(self + 1),msg,to);
  if (iVar1 == -0xb) {
    iVar2 = -0xb;
  }
  else {
    iVar2 = 0;
    if (iVar1 < 0) {
      nn_xreq_send_to_cold_1();
    }
  }
  return iVar2;
}

Assistant:

int nn_xreq_send_to (struct nn_sockbase *self, struct nn_msg *msg,
    struct nn_pipe **to)
{
    int rc;

    /*  If request cannot be sent due to the pushback, drop it silenly. */
    rc = nn_lb_send (&nn_cont (self, struct nn_xreq, sockbase)->lb, msg, to);
    if (nn_slow (rc == -EAGAIN))
        return -EAGAIN;
    errnum_assert (rc >= 0, -rc);

    return 0;
}